

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_cache.c
# Opt level: O1

ent * get_ent(state *s,int i)

{
  int iVar1;
  _Bool _Var2;
  uint uVar3;
  ent *peVar4;
  uint uVar5;
  int iVar6;
  
  if (i < (s->cache).i0) {
    return (ent *)0x0;
  }
  iVar1 = (s->cache).i1;
  if (iVar1 < i) {
LAB_00103147:
    peVar4 = (ent *)0x0;
  }
  else {
    if (iVar1 == i) {
      _Var2 = (*(s->op).parse)(s);
      if (!_Var2) goto LAB_00103147;
    }
    iVar6 = i - (s->cache).i0;
    iVar1 = (s->cache).k;
    uVar5 = iVar6 + iVar1;
    uVar3 = iVar6 + 0xfff + iVar1;
    if (-1 < (int)uVar5) {
      uVar3 = uVar5;
    }
    peVar4 = (s->cache).ent + (int)(uVar5 - (uVar3 & 0xfffff000));
  }
  return peVar4;
}

Assistant:

struct ent *
get_ent(struct state *s, int i)
{
	struct cache *c = &s->cache;

	if (i < c->i0 || i > c->i1)
		return NULL;

	if (i == c->i1 && !s->op.parse(s))
		return NULL;

	return CACHE_ENT(s, i);
}